

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_6e813::getEdgePoints<double>
               (vector<double,_std::allocator<double>_> *edge,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int minimumContrast;
  uint uVar7;
  uint32_t size;
  ulong uVar8;
  ulong uVar9;
  bool checkContrast;
  uint uVar10;
  uint uVar11;
  uint rightSideOffset;
  ulong uVar12;
  uint32_t j;
  ulong uVar13;
  uint uVar14;
  uint rightSideOffset_00;
  uint32_t leftSideOffset;
  uint32_t position;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  
  minimumContrast = (uint)edgeParameter->minimumContrast * edgeParameter->groupFactor;
  size = (uint32_t)
         ((ulong)((long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
  checkContrast =
       edgeParameter->contrastCheckRightSideOffset != 0 &&
       edgeParameter->contrastCheckLeftSideOffset != 0;
  uVar10 = 2;
  uVar12 = 1;
  do {
    if (size - 2 <= uVar12) {
      return;
    }
    piVar3 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar17 = uVar12 + 1;
    if ((-1 < piVar3[uVar12]) && (piVar3[uVar17] < 1)) {
      piVar3 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = piVar3[uVar17];
      if (piVar3[uVar17] < piVar3[uVar12]) {
        uVar11 = piVar3[uVar12];
      }
      if (0 < (int)uVar11) {
        uVar13 = (ulong)uVar10;
        uVar7 = uVar11 / 3;
        if (uVar11 < 3) {
          uVar7 = 1;
        }
        uVar14 = uVar11 >> 1;
        if (uVar11 == 1) {
          uVar14 = 1;
        }
        uVar15 = uVar12 & 0xffffffff;
        uVar8 = uVar12 & 0xffffffff;
        bVar6 = false;
        do {
          leftSideOffset = (uint32_t)uVar15;
          iVar1 = piVar3[uVar15];
          uVar9 = uVar8;
          bVar4 = bVar6;
          if (iVar1 < (int)uVar14) {
            bVar4 = true;
            uVar9 = uVar15;
          }
          if (bVar6) {
            uVar9 = uVar8;
            bVar4 = bVar6;
          }
          position = (uint32_t)uVar12;
          if (iVar1 < (int)uVar7) goto LAB_001157fd;
          uVar15 = (ulong)(leftSideOffset - 1);
        } while ((iVar1 <= (int)uVar11) && (uVar8 = uVar9, bVar6 = bVar4, leftSideOffset != 0));
        leftSideOffset = position;
        if ((iVar1 < (int)uVar7) || (bVar4)) {
LAB_001157fd:
          bVar6 = false;
          uVar12 = uVar17 & 0xffffffff;
          rightSideOffset_00 = uVar10;
          do {
            rightSideOffset = (uint)uVar12;
            bVar16 = 1;
            if (size - 1 <= uVar13) break;
            iVar2 = piVar3[uVar13];
            bVar5 = bVar6;
            if (iVar2 < (int)uVar14) {
              bVar5 = true;
              rightSideOffset = rightSideOffset_00;
            }
            if (!bVar6) {
              uVar12 = (ulong)rightSideOffset;
              bVar6 = bVar5;
            }
            rightSideOffset = (uint)uVar12;
            if (iVar2 < (int)uVar7) {
              bVar16 = 0;
              goto LAB_00115862;
            }
            uVar13 = uVar13 + 1;
            rightSideOffset_00 = rightSideOffset_00 + 1;
          } while (iVar2 <= (int)uVar11);
          rightSideOffset_00 = (uint)uVar17;
LAB_00115862:
          if ((bVar4) && (bVar6)) {
            bVar6 = findPoint<double>(data,second,edge,(uint32_t)uVar9,rightSideOffset,
                                      minimumContrast,checkContrast,
                                      edgeParameter->contrastCheckLeftSideOffset,
                                      edgeParameter->contrastCheckRightSideOffset,position,size);
            bVar16 = bVar16 | bVar6 | (int)uVar7 <= iVar1;
          }
          else {
            bVar16 = bVar16 | (int)uVar7 <= iVar1;
          }
          if (bVar16 == 0) {
            findPoint<double>(data,second,edge,leftSideOffset,rightSideOffset_00,minimumContrast,
                              checkContrast,edgeParameter->contrastCheckLeftSideOffset,
                              edgeParameter->contrastCheckRightSideOffset,position,size);
          }
        }
      }
    }
    uVar10 = uVar10 + 1;
    uVar12 = uVar17;
  } while( true );
}

Assistant:

void getEdgePoints( std::vector < _Type > & edge, const std::vector < int > & data, const std::vector < int > & first, const std::vector < int > & second, const EdgeParameter & edgeParameter )
    {
        const uint32_t dataSize = static_cast<uint32_t>(data.size()); // we know that initial size is uint32_t
        const int minimumContrast = static_cast<int>(edgeParameter.minimumContrast * edgeParameter.groupFactor);

        const bool checkContrast = (edgeParameter.contrastCheckLeftSideOffset > 0u) && (edgeParameter.contrastCheckRightSideOffset > 0u);

        for ( uint32_t i = 1u; i < dataSize - 2u; i++ ) {
            if ( second[i] < 0 || second[i + 1] > 0 )
                continue;

            const int maxGradient = (first[i] > first[i + 1]) ? first[i] : first[i + 1];

            if ( maxGradient <= 0 )
                continue;

            const int minGradientValue = (maxGradient < 3) ? 1 : maxGradient / 3;
            const int halfGradient     = (maxGradient < 2) ? 1 : maxGradient / 2;

            // left side
            bool normalGradientleftEdgeFound  = false;
            bool minimumGradientLeftEdgeFound = false;

            uint32_t normalLeftSide  = i;
            uint32_t minimumLeftSide = i;

            for ( uint32_t j = i; ; --j ) {
                if ( !normalGradientleftEdgeFound && first[j] < halfGradient ) {
                    normalLeftSide = j;
                    normalGradientleftEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumLeftSide = j;
                    minimumGradientLeftEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;

                if ( j == 0u ) // this is to avoid out of bounds situation
                    break;
            }

            if ( !normalGradientleftEdgeFound && !minimumGradientLeftEdgeFound )
                continue;

            // right side
            bool normalGradientRightEdgeFound  = false;
            bool minimumGradientRightEdgeFound = false;

            uint32_t normalRightSide  = i + 1u;
            uint32_t minimumRightSide = i + 1u;

            for ( uint32_t j = i + 1u; j < dataSize - 1u; ++j ) {
                if ( !normalGradientRightEdgeFound && first[j] < halfGradient ) {
                    normalRightSide = j;
                    normalGradientRightEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumRightSide = j;
                    minimumGradientRightEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;
            }

            bool edgeFound = false;

            if ( normalGradientleftEdgeFound && normalGradientRightEdgeFound ) {
                edgeFound = findPoint( data, second, edge, normalLeftSide, normalRightSide, minimumContrast, checkContrast,
                                       edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                                       i, dataSize );
            }

            if ( !edgeFound && minimumGradientLeftEdgeFound && minimumGradientRightEdgeFound ) {
                findPoint( data, second, edge, minimumLeftSide, minimumRightSide, minimumContrast, checkContrast,
                           edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                           i, dataSize );
            }
        }
    }